

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Launcher.cpp
# Opt level: O2

void __thiscall Launcher::~Launcher(Launcher *this)

{
  std::__cxx11::string::~string((string *)&this->_pathToFiles);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_engine).super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_model).super___shared_ptr<MachineLearningModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_dataHandler).super___shared_ptr<DataHandler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<Launcher>)._M_weak_this.
              super___weak_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Launcher::~Launcher()
{
}